

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::FiberBase::FiberBase
          (FiberBase *this,FiberPool *pool,ExceptionOrValue *result,SourceLocation location)

{
  Disposer *pDVar1;
  FiberStack *pFVar2;
  EventLoop *pEVar3;
  Own<kj::_::FiberStack,_std::nullptr_t> OVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_006dd340;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_006dda40;
  pEVar3 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar3;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  (this->super_Event).location.fileName = location.fileName;
  (this->super_Event).location.function = location.function;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_006dcd90;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_006dcde0;
  this->state = WAITING;
  this->currentInner = (OwnPromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  (this->stack).disposer = (Disposer *)0x0;
  (this->stack).ptr = (FiberStack *)0x0;
  this->result = result;
  OVar4 = FiberPool::Impl::takeStack((Impl *)&stack0xffffffffffffffd8);
  pDVar1 = (this->stack).disposer;
  pFVar2 = (this->stack).ptr;
  *(undefined4 *)&(this->stack).disposer = local_28;
  *(undefined4 *)((long)&(this->stack).disposer + 4) = uStack_24;
  *(undefined4 *)&(this->stack).ptr = uStack_20;
  *(undefined4 *)((long)&(this->stack).ptr + 4) = uStack_1c;
  _uStack_20 = 0;
  if (pFVar2 != (FiberStack *)0x0) {
    (**pDVar1->_vptr_Disposer)(pDVar1,pFVar2,OVar4.ptr);
    if (_uStack_20 != 0) {
      _uStack_20 = 0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_24,local_28))();
    }
  }
  FiberStack::initialize((this->stack).ptr,this);
  return;
}

Assistant:

FiberBase::FiberBase(const FiberPool& pool, _::ExceptionOrValue& result, SourceLocation location)
    : Event(location), state(WAITING), result(result) {
  stack = pool.impl->takeStack();
  stack->initialize(*this);
  ensureThreadCanRunFibers();
}